

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O1

int32 make_dict_triphone_list
                (dicthashelement_t **dicthash,hashelement_t ***triphonehash,int ignore_wpos)

{
  char **ppcVar1;
  char *pcVar2;
  phnhashelement_t *ppVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  hashelement_t **hashtable;
  phnhashelement_t **hashtable_00;
  phnhashelement_t **hashtable_01;
  char *pcVar7;
  phnhashelement_t *ppVar8;
  hashelement_t *phVar9;
  long lVar10;
  char *wp;
  uint uVar11;
  char *wp_00;
  dicthashelement_t *pdVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  char *__s1;
  long lVar18;
  bool bVar19;
  uint local_b0;
  uint local_ac;
  uint local_74;
  
  hashtable = (hashelement_t **)
              __ckd_calloc__(0x5dc1,0x30,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                             ,0x159);
  hashtable_00 = (phnhashelement_t **)calloc(0x65,0x18);
  hashtable_01 = (phnhashelement_t **)calloc(0x65,0x18);
  if ((hashtable_00 == (phnhashelement_t **)0x0) || (hashtable_01 == (phnhashelement_t **)0x0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x15d,"Unable to alloc %d size phone hashtables!\n",0x65);
    exit(1);
  }
  phninstall("SIL",hashtable_00);
  phninstall("SIL",hashtable_01);
  lVar15 = 0;
  do {
    for (pdVar12 = dicthash[lVar15]; pdVar12 != (dicthashelement_t *)0x0; pdVar12 = pdVar12->next) {
      pcVar7 = *pdVar12->phones;
      if ((*pcVar7 != '+') && (iVar4 = strcmp(pcVar7,"SIL"), iVar4 != 0)) {
        phninstall(pcVar7,hashtable_00);
      }
      pcVar7 = pdVar12->phones[(long)pdVar12->nphns + -1];
      if ((*pcVar7 != '+') && (iVar4 = strcmp(pcVar7,"SIL"), iVar4 != 0)) {
        phninstall(pcVar7,hashtable_01);
      }
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x2717);
  bVar19 = ignore_wpos != 0;
  pcVar7 = "b";
  if (bVar19) {
    pcVar7 = "i";
  }
  wp = "e";
  if (bVar19) {
    wp = "i";
  }
  wp_00 = "s";
  if (bVar19) {
    wp_00 = "i";
  }
  lVar15 = 0;
  uVar11 = 0;
  local_74 = 0;
  uVar17 = 0;
  local_ac = 0;
  uVar13 = 0;
  do {
    pdVar12 = dicthash[lVar15];
joined_r0x00104002:
    if (pdVar12 != (dicthashelement_t *)0x0) {
      do {
        uVar5 = (uint)uVar13;
LAB_00104013:
        uVar5 = uVar5 + 1;
        uVar13 = (ulong)uVar5;
        iVar4 = pdVar12->nphns;
        ppcVar1 = pdVar12->phones;
        pcVar2 = *ppcVar1;
        local_b0 = (uint)uVar17;
        if ((long)iVar4 == 1) {
          if ((*pcVar2 == '+') || (iVar4 = strcmp(pcVar2,"SIL"), iVar4 == 0)) goto LAB_00104088;
          lVar10 = 0;
          do {
            for (ppVar8 = hashtable_01[lVar10]; ppVar8 != (phnhashelement_t *)0x0;
                ppVar8 = ppVar8->next) {
              pcVar14 = ppVar8->phone;
              lVar18 = 0;
              do {
                for (ppVar3 = hashtable_00[lVar18]; ppVar3 != (phnhashelement_t *)0x0;
                    ppVar3 = ppVar3->next) {
                  phVar9 = install(pcVar2,pcVar14,ppVar3->phone,wp_00,hashtable);
                  uVar11 = uVar11 + (phVar9->dictcount == 0);
                  phVar9->dictcount = phVar9->dictcount + 1;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 != 0x65);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x65);
          goto LAB_001042ca;
        }
        if ((*pcVar2 == '+') || (iVar6 = strcmp(pcVar2,"SIL"), iVar6 == 0)) goto LAB_00104088;
        pcVar14 = ppcVar1[1];
        if ((*pcVar14 == '+') || (iVar6 = strcmp(pcVar14,"SIL"), iVar6 == 0)) {
          pcVar14 = "SIL";
        }
        lVar10 = 0;
        do {
          for (ppVar8 = hashtable_01[lVar10]; ppVar8 != (phnhashelement_t *)0x0;
              ppVar8 = ppVar8->next) {
            phVar9 = install(pcVar2,ppVar8->phone,pcVar14,pcVar7,hashtable);
            local_ac = local_ac + (phVar9->dictcount == 0);
            phVar9->dictcount = phVar9->dictcount + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x65);
        if (2 < iVar4) {
          uVar16 = 1;
          do {
            ppcVar1 = pdVar12->phones;
            pcVar2 = ppcVar1[uVar16];
            if ((*pcVar2 != '+') && (iVar6 = strcmp(pcVar2,"SIL"), iVar6 != 0)) {
              pcVar14 = ppcVar1[uVar16 - 1];
              if ((*pcVar14 == '+') || (iVar6 = strcmp(pcVar14,"SIL"), iVar6 == 0)) {
                pcVar14 = "SIL";
              }
              __s1 = ppcVar1[uVar16 + 1];
              if ((*__s1 == '+') || (iVar6 = strcmp(__s1,"SIL"), iVar6 == 0)) {
                __s1 = "SIL";
              }
              phVar9 = install(pcVar2,pcVar14,__s1,"i",hashtable);
              local_74 = local_74 + (phVar9->dictcount == 0);
              phVar9->dictcount = phVar9->dictcount + 1;
            }
            uVar16 = uVar16 + 1;
          } while (iVar4 - 1U != uVar16);
        }
        ppcVar1 = pdVar12->phones;
        pcVar2 = ppcVar1[(int)(iVar4 - 1U)];
        if ((*pcVar2 != '+') && (iVar6 = strcmp(pcVar2,"SIL"), iVar6 != 0)) goto LAB_0010435a;
        pdVar12 = pdVar12->next;
        if (pdVar12 == (dicthashelement_t *)0x0) break;
      } while( true );
    }
LAB_00104400:
    lVar15 = lVar15 + 1;
    if (lVar15 == 0x2717) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1ba,"%d words in dictionary\n",uVar13);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bb,"%d unique single word triphones in dictionary\n",(ulong)uVar11);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bc,"%d unique word beginning triphones in dictionary\n",(ulong)local_ac);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bd,"%d unique word internal triphones in dictionary\n",(ulong)local_74);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1be,"%d unique word ending triphones in dictionary\n",uVar17);
      *triphonehash = hashtable;
      freephnhash(hashtable_00);
      freephnhash(hashtable_01);
      return 0;
    }
  } while( true );
LAB_0010435a:
  pcVar14 = ppcVar1[(long)iVar4 + -2];
  if ((*pcVar14 == '+') || (iVar4 = strcmp(pcVar14,"SIL"), iVar4 == 0)) {
    pcVar14 = "SIL";
  }
  lVar10 = 0;
  do {
    for (ppVar8 = hashtable_00[lVar10]; ppVar8 != (phnhashelement_t *)0x0; ppVar8 = ppVar8->next) {
      phVar9 = install(pcVar2,pcVar14,ppVar8->phone,wp,hashtable);
      local_b0 = local_b0 + (phVar9->dictcount == 0);
      phVar9->dictcount = phVar9->dictcount + 1;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x65);
LAB_001042ca:
  pdVar12 = pdVar12->next;
  uVar17 = (ulong)local_b0;
  goto joined_r0x00104002;
LAB_00104088:
  pdVar12 = pdVar12->next;
  if (pdVar12 == (dicthashelement_t *)0x0) goto LAB_00104400;
  goto LAB_00104013;
}

Assistant:

int32 make_dict_triphone_list (dicthashelement_t **dicthash,
			  hashelement_t ***triphonehash,
			  int ignore_wpos)
{
    hashelement_t **tphnhash, *tphnptr;
    dicthashelement_t *word_el;
    phnhashelement_t *bphnptr, **bphnhash, *ephnptr, **ephnhash;
    char *bphn, *lctx, *rctx;
    const char* wpos;
    char *silencephn = "SIL";
    int32 totaltphs, totwds, bwdtphs, ewdtphs, iwdtphs, swdtphs, lnphns;
    int32 i,j,k;

    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t));
    bphnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    ephnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    if (bphnhash == NULL || ephnhash == NULL)
	E_FATAL("Unable to alloc %d size phone hashtables!\n",(int)PHNHASHSIZE);

    /*First count all phones that can begin or end a word (SIL can by default)*/
    phninstall(silencephn,bphnhash);
    phninstall(silencephn,ephnhash);
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    if (!IS_FILLER(word_el->phones[0]))
	        phninstall(word_el->phones[0],bphnhash);
	    if (!IS_FILLER(word_el->phones[word_el->nphns - 1]))
	        phninstall(word_el->phones[word_el->nphns - 1],ephnhash);
	    word_el = word_el->next;
        }
    }

    /* Scan dictionary and make triphone list */
    totwds = bwdtphs = ewdtphs = iwdtphs = swdtphs = 0;
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    totwds++;
            lnphns = word_el->nphns;
            if (lnphns == 1) {
                wpos = wordpos2str(WORD_POSN_SINGLE, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
		        for (k = 0; k < PHNHASHSIZE; k++){
		    	    bphnptr = bphnhash[k];
		    	    while (bphnptr != NULL){
				rctx = bphnptr->phone;
                                tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
				if (tphnptr->dictcount == 0) swdtphs++;
				tphnptr->dictcount++;
				bphnptr = bphnptr->next;
			    }
			}
			ephnptr = ephnptr->next;
		    }
		}
            }
            else {
                wpos = wordpos2str(WORD_POSN_BEGIN, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		rctx = word_el->phones[1];
		if (IS_FILLER(rctx)) rctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) bwdtphs++;
			tphnptr->dictcount++;
			ephnptr = ephnptr->next;
		    }
		}
                wpos = wordpos2str(WORD_POSN_INTERNAL, ignore_wpos);
                for (j=1;j<lnphns-1;j++){
                    bphn = word_el->phones[j];
		    if (IS_FILLER(bphn)) continue;
                    lctx = word_el->phones[j-1];
		    if (IS_FILLER(lctx)) lctx = silencephn;
                    rctx = word_el->phones[j+1];
		    if (IS_FILLER(rctx)) rctx = silencephn;
                    tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
		    if (tphnptr->dictcount == 0) iwdtphs++;
		    tphnptr->dictcount++;
                }
                wpos = wordpos2str(WORD_POSN_END, ignore_wpos);
                bphn = word_el->phones[lnphns-1];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		lctx = word_el->phones[lnphns-2];
		if (IS_FILLER(lctx)) lctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    bphnptr = bphnhash[j];
		    while (bphnptr != NULL){
			rctx = bphnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) ewdtphs++;
			tphnptr->dictcount++;
			bphnptr = bphnptr->next;
		    }
		}
            }
	    word_el = word_el->next;
        }
    }
    totaltphs = swdtphs + bwdtphs + iwdtphs + ewdtphs;
    E_INFO("%d words in dictionary\n",totwds);
    E_INFO("%d unique single word triphones in dictionary\n",swdtphs);
    E_INFO("%d unique word beginning triphones in dictionary\n",bwdtphs);
    E_INFO("%d unique word internal triphones in dictionary\n",iwdtphs);
    E_INFO("%d unique word ending triphones in dictionary\n",ewdtphs);

    *triphonehash = tphnhash;

    freephnhash(bphnhash); freephnhash(ephnhash);

    return S3_SUCCESS;
}